

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth_test.c
# Opt level: O2

REF_STATUS
ref_smooth_tet_two_fixture
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT *target_node,REF_INT *top_node)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&node);
    if (uVar4 == 0) {
      pRVar2 = ref_node->real;
      pRVar3 = pRVar2 + (long)node * 0xf;
      *pRVar3 = 0.0;
      pRVar3[1] = 0.0;
      pRVar2[(long)node * 0xf + 2] = 0.0;
      nodes[0] = node;
      uVar4 = ref_node_add(ref_node,1,&node);
      if (uVar4 == 0) {
        pRVar3 = ref_node->real;
        pRVar3[(long)node * 0xf] = 1.0;
        pRVar3 = pRVar3 + (long)node * 0xf + 1;
        *pRVar3 = 0.0;
        pRVar3[1] = 0.0;
        nodes[1] = node;
        uVar4 = ref_node_add(ref_node,2,&node);
        if (uVar4 == 0) {
          pRVar2 = ref_node->real;
          pRVar3 = pRVar2 + (long)node * 0xf;
          *(undefined4 *)pRVar3 = 0;
          *(undefined4 *)((long)pRVar3 + 4) = 0;
          *(undefined4 *)(pRVar3 + 1) = 0;
          *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
          pRVar2[(long)node * 0xf + 2] = 0.0;
          nodes[2] = node;
          uVar4 = ref_node_add(ref_node,3,&node);
          if (uVar4 == 0) {
            pRVar2 = ref_node->real;
            pRVar3 = pRVar2 + (long)node * 0xf;
            *pRVar3 = 1.0;
            pRVar3[1] = 0.0;
            pRVar2[(long)node * 0xf + 2] = 1.0;
            nodes[3] = node;
            *target_node = node;
            uVar4 = ref_cell_add(pRVar1->cell[8],nodes,&cell);
            if (uVar4 == 0) {
              nodes[1] = nodes[2];
              uVar4 = ref_node_add(ref_node,4,&node);
              if (uVar4 == 0) {
                pRVar2 = ref_node->real;
                pRVar3 = pRVar2 + (long)node * 0xf;
                *pRVar3 = 0.0;
                pRVar3[1] = 0.0;
                pRVar2[(long)node * 0xf + 2] = 1.0;
                nodes[2] = node;
                *top_node = node;
                uVar4 = ref_cell_add(pRVar1->cell[8],nodes,&cell);
                if (uVar4 == 0) {
                  return 0;
                }
                pcVar6 = "add tri";
                uVar5 = 0xde;
              }
              else {
                pcVar6 = "add node";
                uVar5 = 0xd6;
              }
            }
            else {
              pcVar6 = "add tri";
              uVar5 = 0xd2;
            }
          }
          else {
            pcVar6 = "add node";
            uVar5 = 0xca;
          }
        }
        else {
          pcVar6 = "add node";
          uVar5 = 0xc4;
        }
      }
      else {
        pcVar6 = "add node";
        uVar5 = 0xbe;
      }
    }
    else {
      pcVar6 = "add node";
      uVar5 = 0xb8;
    }
  }
  else {
    pcVar6 = "grid";
    uVar5 = 0xb2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c",
         uVar5,"ref_smooth_tet_two_fixture",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tet_two_fixture(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     REF_INT *target_node,
                                                     REF_INT *top_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  /* 0-1-2 base, 0-2-4 wall, 3 free */

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[0] = node;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[1] = node;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[2] = node;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[3] = node;

  *target_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  nodes[1] = nodes[2];

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[2] = node;

  *top_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  return REF_SUCCESS;
}